

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseCompressedBase.h
# Opt level: O2

void __thiscall
Eigen::SparseCompressedBase<Eigen::SparseMatrix<double,_0,_int>_>::InnerIterator::InnerIterator
          (InnerIterator *this,SparseCompressedBase<Eigen::SparseMatrix<double,_0,_int>_> *mat,
          Index outer)

{
  long lVar1;
  long lVar2;
  
  this->m_values = *(Scalar **)(mat + 0x28);
  this->m_indices = *(StorageIndex **)(mat + 0x30);
  (this->m_outer).m_value = outer;
  lVar1 = *(long *)(mat + 0x18);
  lVar2 = (long)*(int *)(lVar1 + outer * 4);
  this->m_id = lVar2;
  if (*(long *)(mat + 0x20) == 0) {
    lVar2 = (long)*(int *)(lVar1 + 4 + outer * 4);
  }
  else {
    lVar2 = *(int *)(*(long *)(mat + 0x20) + outer * 4) + lVar2;
  }
  this->m_end = lVar2;
  return;
}

Assistant:

InnerIterator(const SparseCompressedBase& mat, Index outer)
      : m_values(mat.valuePtr()), m_indices(mat.innerIndexPtr()), m_outer(outer)
    {
      if(Derived::IsVectorAtCompileTime && mat.outerIndexPtr()==0)
      {
        m_id = 0;
        m_end = mat.nonZeros();
      }
      else
      {
        m_id = mat.outerIndexPtr()[outer];
        if(mat.isCompressed())
          m_end = mat.outerIndexPtr()[outer+1];
        else
          m_end = m_id + mat.innerNonZeroPtr()[outer];
      }
    }